

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

size_t find_key_in_map(int key,el_keymap_t *map,size_t mapsz)

{
  bool bVar1;
  ulong local_30;
  size_t i;
  size_t mapsz_local;
  el_keymap_t *map_local;
  int key_local;
  
  local_30 = 0;
  while( true ) {
    bVar1 = false;
    if (local_30 < mapsz) {
      bVar1 = map[local_30].Function != (el_keymap_func_t *)0x0;
    }
    if (!bVar1) break;
    if (map[local_30].Key == key) {
      return local_30;
    }
    local_30 = local_30 + 1;
  }
  if (mapsz <= local_30) {
    return mapsz;
  }
  return local_30;
}

Assistant:

static size_t find_key_in_map(int key, el_keymap_t map[], size_t mapsz)
{
    size_t i;

    for (i = 0; i < mapsz && map[i].Function; i++) {
        if (map[i].Key == key)
            return i;
    }

    if (i < mapsz)
        return i;

    return mapsz;
}